

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O2

bool __thiscall
duckdb::StrpTimeFormat::TryParseTimestampNS
          (StrpTimeFormat *this,char *data,size_t size,timestamp_ns_t *result)

{
  bool bVar1;
  ParseResult parse_result;
  ParseResult PStack_78;
  
  PStack_78.tz._M_dataplus._M_p = (pointer)&PStack_78.tz.field_2;
  PStack_78.tz._M_string_length = 0;
  PStack_78.tz.field_2._M_local_buf[0] = '\0';
  PStack_78.error_message._M_dataplus._M_p = (pointer)&PStack_78.error_message.field_2;
  PStack_78.error_message._M_string_length = 0;
  PStack_78.error_message.field_2._M_local_buf[0] = '\0';
  PStack_78.error_position.index = 0xffffffffffffffff;
  bVar1 = Parse(this,data,size,&PStack_78,false);
  if (bVar1) {
    bVar1 = ParseResult::TryToTimestampNS(&PStack_78,result);
  }
  else {
    bVar1 = false;
  }
  ParseResult::~ParseResult(&PStack_78);
  return bVar1;
}

Assistant:

bool StrpTimeFormat::TryParseTimestampNS(const char *data, size_t size, timestamp_ns_t &result) const {
	ParseResult parse_result;
	if (!Parse(data, size, parse_result)) {
		return false;
	}
	return parse_result.TryToTimestampNS(result);
}